

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O2

Machine * runInst(Machine *__return_storage_ptr__,Machine *m,Inst *i)

{
  Register r;
  Register r_00;
  Register r_01;
  Register r_02;
  Register r_03;
  Register r_04;
  int iVar1;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  char *in_R8;
  int in_R9D;
  Machine *this;
  Functor *__return_storage_ptr___00;
  int in_stack_fffffffffffffce8;
  Machine local_2a8;
  Machine local_238;
  Machine local_1c8;
  Machine local_158;
  Machine local_e8;
  Functor local_78;
  Functor local_50;
  
  iVar1 = 0x10a004;
  switch(i->tag_) {
  case PutStructure:
    this = &local_158;
    Machine::Machine(this,m);
    Arg::r((i->args).super__Vector_base<Arg,_std::allocator<Arg>_>._M_impl.super__Vector_impl_data.
           _M_start,m,extraout_RDX,iVar1,in_R8,in_R9D,in_stack_fffffffffffffce8);
    __return_storage_ptr___00 = &local_78;
    Arg::f(__return_storage_ptr___00,
           (i->args).super__Vector_base<Arg,_std::allocator<Arg>_>._M_impl.super__Vector_impl_data.
           _M_start + 1);
    putStructure(__return_storage_ptr__,this,r,__return_storage_ptr___00);
    goto LAB_001036f1;
  case SetVariable:
    this = (Machine *)&stack0xfffffffffffffce8;
    Machine::Machine(this,m);
    Arg::r((i->args).super__Vector_base<Arg,_std::allocator<Arg>_>._M_impl.super__Vector_impl_data.
           _M_start,m,extraout_RDX_03,iVar1,in_R8,in_R9D,in_stack_fffffffffffffce8);
    setVariable(__return_storage_ptr__,this,r_03);
    break;
  case SetValue:
    this = &local_2a8;
    Machine::Machine(this,m);
    Arg::r((i->args).super__Vector_base<Arg,_std::allocator<Arg>_>._M_impl.super__Vector_impl_data.
           _M_start,m,extraout_RDX_01,iVar1,in_R8,in_R9D,in_stack_fffffffffffffce8);
    setValue(__return_storage_ptr__,this,r_01);
    break;
  case GetStructure:
    this = &local_e8;
    Machine::Machine(this,m);
    Arg::r((i->args).super__Vector_base<Arg,_std::allocator<Arg>_>._M_impl.super__Vector_impl_data.
           _M_start,m,extraout_RDX_02,iVar1,in_R8,in_R9D,in_stack_fffffffffffffce8);
    __return_storage_ptr___00 = &local_50;
    Arg::f(__return_storage_ptr___00,
           (i->args).super__Vector_base<Arg,_std::allocator<Arg>_>._M_impl.super__Vector_impl_data.
           _M_start + 1);
    getStructure(__return_storage_ptr__,this,r_02,__return_storage_ptr___00);
LAB_001036f1:
    std::__cxx11::string::~string((string *)__return_storage_ptr___00);
    break;
  case UnifyVariable:
    this = &local_238;
    Machine::Machine(this,m);
    Arg::r((i->args).super__Vector_base<Arg,_std::allocator<Arg>_>._M_impl.super__Vector_impl_data.
           _M_start,m,extraout_RDX_00,iVar1,in_R8,in_R9D,in_stack_fffffffffffffce8);
    unifyVariable(__return_storage_ptr__,this,r_00);
    break;
  case UnifyValue:
    this = &local_1c8;
    Machine::Machine(this,m);
    Arg::r((i->args).super__Vector_base<Arg,_std::allocator<Arg>_>._M_impl.super__Vector_impl_data.
           _M_start,m,extraout_RDX_04,iVar1,in_R8,in_R9D,in_stack_fffffffffffffce8);
    unifyValue(__return_storage_ptr__,this,r_04);
    break;
  default:
    __assert_fail("false && \"unreachable\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/bollu[P]warren-cpp/src/lzero.cpp"
                  ,0x288,"Machine runInst(Machine, Inst)");
  }
  Machine::~Machine(this);
  return __return_storage_ptr__;
}

Assistant:

Machine runInst(Machine m, Inst i) {
    switch (i.tag()) {
        case PutStructure: return putStructure(m, i.get<Register>(0), i.get<Functor>(1));
        case SetVariable: return setVariable(m, i.get<Register>(0));
        case SetValue: return setValue(m, i.get<Register>(0));
        case GetStructure: return getStructure(m, i.get<Register>(0), i.get<Functor>(1));
        case UnifyVariable: return unifyVariable(m, i.get<Register>(0));
        case UnifyValue: return unifyValue(m, i.get<Register>(0));
    }
    assert(false && "unreachable");
}